

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseDispatch<float>::
     call<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>,std::function<float()>>
               (QPromiseResolve<float> *resolve,QPromiseReject<float> *reject,function<float_()> *fn
               )

{
  float local_14;
  
  local_14 = std::function<float_()>::operator()(fn);
  PromiseResolver<float>::resolve<float>(&resolve->m_resolver,&local_14);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }